

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
re2::CaptureNamesWalker::ShortVisit(CaptureNamesWalker *this,Regexp *re,Ignored ignored)

{
  ostream *poVar1;
  Ignored in_EDX;
  LogMessage *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  LogMessage *in_stack_fffffffffffffe90;
  
  LogMessage::LogMessage
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  poVar1 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe68);
  std::operator<<(poVar1,"CaptureNamesWalker::ShortVisit called");
  LogMessage::~LogMessage(in_stack_fffffffffffffe60);
  return in_EDX;
}

Assistant:

virtual Ignored ShortVisit(Regexp* re, Ignored ignored) {
    // Should never be called: we use Walk not WalkExponential.
    LOG(DFATAL) << "CaptureNamesWalker::ShortVisit called";
    return ignored;
  }